

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Indexing::TermWithoutValue>::FastGeneralizationsIterator::
init<Kernel::TypedTermList>
          (FastGeneralizationsIterator *this,SubstitutionTree<Indexing::TermWithoutValue> *parent,
          Node *root,TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  TypedTermList term;
  TypedTermList query_00;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  anon_class_8_1_8991fb9c in_RCX;
  long *in_RDX;
  long in_RSI;
  SubstitutionTree<Indexing::TermWithoutValue> *in_RDI;
  TermList in_R8;
  byte in_R9B;
  byte in_stack_00000008;
  VirtualIterator<Indexing::TermWithoutValue_*> *in_stack_ffffffffffffff98;
  VirtualIterator<Indexing::TermWithoutValue_*> *in_stack_ffffffffffffffa0;
  SortId in_stack_ffffffffffffffb0;
  undefined1 local_48 [4];
  uint in_stack_ffffffffffffffbc;
  undefined6 in_stack_ffffffffffffffd0;
  
  bVar3 = in_R9B & 1;
  bVar1 = in_stack_00000008 & 1;
  *(byte *)&in_RDI->_nextVar = bVar3;
  bVar2 = (**(code **)(*in_RDX + 0x10))();
  *(byte *)((long)&in_RDI->_nextVar + 1) = bVar2 & 1;
  query_00._sort._content._0_6_ = in_stack_ffffffffffffffd0;
  query_00.super_TermList._content = in_R8._content;
  query_00._sort._content._6_1_ = bVar1;
  query_00._sort._content._7_1_ = bVar3;
  SubstitutionTree<Indexing::TermWithoutValue>::GenMatcher::init<Kernel::TypedTermList>
            ((GenMatcher *)in_RCX.this,query_00,in_stack_ffffffffffffffbc);
  if (((ulong)*(IteratorCore<Indexing::TermWithoutValue_*> **)&in_RDI->_nextVar & 0x100) == 0) {
    Lib::VirtualIterator<Indexing::TermWithoutValue_*>::getEmpty();
  }
  else {
    (**(code **)(*in_RDX + 0x40))(local_48);
  }
  Lib::VirtualIterator<Indexing::TermWithoutValue_*>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Lib::VirtualIterator<Indexing::TermWithoutValue_*>::~VirtualIterator
            ((VirtualIterator<Indexing::TermWithoutValue_*> *)in_RDI);
  *(long **)&in_RDI[6].field_0x10 = in_RDX;
  InstanceCntr::InstanceCntr((InstanceCntr *)&stack0xffffffffffffffb7,(Cntr *)(in_RSI + 0x10));
  term._sort._content = in_stack_ffffffffffffffb0._content;
  term.super_TermList._content = in_R8._content;
  createBindings<Indexing::SubstitutionTree<Indexing::TermWithoutValue>::FastGeneralizationsIterator::init<Kernel::TypedTermList>(Indexing::SubstitutionTree<Indexing::TermWithoutValue>*,Indexing::SubstitutionTree<Indexing::TermWithoutValue>::Node*,Kernel::TypedTermList,bool,bool)::_lambda(unsigned_int,Kernel::TermList)_1_>
            (in_RDI,term,SUB81((ulong)in_RDI >> 0x38,0),in_RCX);
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed) {
        _retrieveSubstitution = retrieveSubstitution;
        _inLeaf = root->isLeaf();
        _subst.init(query, parent->_nextVar);
        _ldIterator = _inLeaf ? static_cast<Leaf*>(root)->allChildren() : LDIterator::getEmpty();
        _root = root;

        _iterCntr = parent->_iterCnt;
        ASS(root);

        parent->createBindings(query, reversed,
            [&](unsigned var, TermList t) { _subst.bindSpecialVar(var, t); });
      }